

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10f1ef::CpuImmediateTest_sbc_carry_but_no_overflow_Test::TestBody
          (CpuImmediateTest_sbc_carry_but_no_overflow_Test *this)

{
  (this->super_CpuImmediateTest).super_CpuTest.registers.a = 'P';
  (this->super_CpuImmediateTest).super_CpuTest.registers.p = 'A';
  (this->super_CpuImmediateTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuImmediateTest).super_CpuTest.expected.a = ' ';
  (this->super_CpuImmediateTest).super_CpuTest.field_0x114 = 0x30;
  CpuImmediateTest::run_instruction(&this->super_CpuImmediateTest,0xe9);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, sbc_carry_but_no_overflow) {
    registers.a = 0x50;
    registers.p = V_FLAG | C_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x20;
    memory_content = 0x30;

    run_instruction(SBC_IMM);
}